

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Type __thiscall wabt::Func::GetLocalType(Func *this,Index index)

{
  pointer ppVar1;
  Type TVar2;
  uint uVar3;
  Index i;
  
  uVar3 = (uint)((ulong)((long)(this->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  i = index - uVar3;
  if (index < uVar3) {
    return (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start[index];
  }
  uVar3 = 0;
  for (ppVar1 = (this->local_types).decls_.
                super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != (this->local_types).decls_.
                super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
    uVar3 = uVar3 + ppVar1->second;
  }
  if (i < uVar3) {
    TVar2 = LocalTypes::operator[](&this->local_types,i);
    return TVar2;
  }
  __assert_fail("index < local_types.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/ir.cc"
                ,0xd9,"Type wabt::Func::GetLocalType(Index) const");
}

Assistant:

Type Func::GetLocalType(Index index) const {
  Index num_params = decl.GetNumParams();
  if (index < num_params) {
    return GetParamType(index);
  } else {
    index -= num_params;
    assert(index < local_types.size());
    return local_types[index];
  }
}